

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

int llhttp_message_needs_eof(llhttp_t *parser)

{
  ushort uVar1;
  uint uVar2;
  
  uVar2 = 0;
  if ((((parser->type != '\x01') && (uVar1 = parser->status_code, 99 < uVar1 - 100)) &&
      (uVar1 != 0xcc)) &&
     (((uVar1 != 0x130 && (uVar1 = parser->flags, (uVar1 & 0x40) == 0)) &&
      (uVar2 = 1, (uVar1 & 0x208) != 0x200)))) {
    uVar2 = (uint)((uVar1 & 0x28) == 0);
  }
  return uVar2;
}

Assistant:

int llhttp_message_needs_eof(const llhttp_t* parser) {
  if (parser->type == HTTP_REQUEST) {
    return 0;
  }

  /* See RFC 2616 section 4.4 */
  if (parser->status_code / 100 == 1 || /* 1xx e.g. Continue */
      parser->status_code == 204 ||     /* No Content */
      parser->status_code == 304 ||     /* Not Modified */
      (parser->flags & F_SKIPBODY)) {     /* response to a HEAD request */
    return 0;
  }

  /* RFC 7230 3.3.3, see `llhttp__after_headers_complete` */
  if ((parser->flags & F_TRANSFER_ENCODING) &&
      (parser->flags & F_CHUNKED) == 0) {
    return 1;
  }

  if (parser->flags & (F_CHUNKED | F_CONTENT_LENGTH)) {
    return 0;
  }

  return 1;
}